

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall wasm::WasmBinaryBuilder::readTags(WasmBinaryBuilder *this)

{
  Module *this_00;
  bool bVar1;
  uint32_t uVar2;
  ostream *poVar3;
  Signature SVar4;
  Name name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  IString local_58;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> local_48;
  ulong local_40;
  ulong local_38;
  
  bVar1 = isDebugEnabled("binary");
  if (bVar1) {
    std::operator<<((ostream *)&std::cerr,"== readTags\n");
  }
  uVar2 = getU32LEB(this);
  local_38 = (ulong)uVar2;
  bVar1 = isDebugEnabled("binary");
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"num: ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  for (local_40 = 0; local_38 != local_40; local_40 = local_40 + 1) {
    bVar1 = isDebugEnabled("binary");
    if (bVar1) {
      std::operator<<((ostream *)&std::cerr,"read one\n");
    }
    getInt8(this);
    uVar2 = getU32LEB(this);
    this_00 = this->wasm;
    std::__cxx11::to_string(&local_78,local_40);
    std::operator+(&local_98,"tag$",&local_78);
    IString::IString(&local_58,&local_98);
    SVar4 = getSignatureByTypeIndex(this,uVar2);
    SVar4.results.id = SVar4.params.id.id;
    SVar4.params.id = (uintptr_t)local_58.str._M_str;
    name.super_IString.str._M_str = (char *)local_58.str._M_len;
    name.super_IString.str._M_len = (size_t)&local_48;
    Builder::makeTag(name,SVar4);
    Module::addTag(this_00,&local_48);
    std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::~unique_ptr(&local_48);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
  }
  return;
}

Assistant:

void WasmBinaryBuilder::readTags() {
  BYN_TRACE("== readTags\n");
  size_t numTags = getU32LEB();
  BYN_TRACE("num: " << numTags << std::endl);
  for (size_t i = 0; i < numTags; i++) {
    BYN_TRACE("read one\n");
    getInt8(); // Reserved 'attribute' field
    auto typeIndex = getU32LEB();
    wasm.addTag(Builder::makeTag("tag$" + std::to_string(i),
                                 getSignatureByTypeIndex(typeIndex)));
  }
}